

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ProgramSharingTest::renderResource
          (GLES2ProgramSharingTest *this,Surface *screen,Surface *reference)

{
  glReadPixelsFunc p_Var1;
  GLenum GVar2;
  GLuint GVar3;
  GLuint GVar4;
  int iVar5;
  TestError *this_00;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  int iVar13;
  uint uVar14;
  int i;
  uint uVar15;
  long lVar16;
  uint uVar17;
  float fVar18;
  float t;
  float fVar19;
  Vector<float,_4> res_4;
  Vector<float,_4> res_3;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vector<float,_4> res_2;
  Vec4 b;
  Vec4 c;
  Vec4 a;
  Vec4 d;
  float local_e8 [6];
  GLsizei local_d0;
  GLsizei local_cc;
  float local_c8 [16];
  IVec4 local_88;
  float local_78 [4];
  PixelBufferAccess local_68;
  float local_40 [2];
  undefined1 *puStack_38;
  
  if (screen == (Surface *)0x0) {
    local_d0 = 0xf0;
    local_cc = 0xf0;
  }
  else {
    local_cc = screen->m_width;
    local_d0 = screen->m_height;
  }
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,local_cc,local_d0);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2c8);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2ca);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2cb);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)((this->m_program->m_program).m_program);
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"useProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2cd);
  GVar3 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    ((this->m_program->m_program).m_program,"a_pos");
  GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar2,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2d0);
  if (GVar3 == 0xffffffff) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"coordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x2d1);
  }
  else {
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                      ((this->m_program->m_program).m_program,"a_color");
    GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar2,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x2d4);
    if (GVar4 != 0xffffffff) {
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar4);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"enableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2d7);
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar3);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"enableVertexAttribArray(coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2d8);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar4,4,0x1406,'\0',0,renderResource::colors);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2da);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar3,2,0x1406,'\0',0,renderResource::coords);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2db);
      (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2dd);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar3);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"disableVertexAttribArray(coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2de);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar4);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"disableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2df);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
      GVar2 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar2,"useProgram(0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2e0);
      if (screen != (Surface *)0x0) {
        p_Var1 = (this->super_GLES2SharingTest).m_gl.readPixels;
        iVar5 = screen->m_width;
        iVar6 = screen->m_height;
        local_88.m_data[0] = RGBA;
        local_88.m_data[1] = UNORM_INT8;
        pvVar12 = (void *)(screen->m_pixels).m_cap;
        if (pvVar12 != (void *)0x0) {
          pvVar12 = (screen->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_68,(TextureFormat *)&local_88,iVar5,iVar6,1,pvVar12);
        (*p_Var1)(0,0,iVar5,iVar6,0x1908,0x1401,local_68.super_ConstPixelBufferAccess.m_data);
        local_88.m_data[0] = RGBA;
        local_88.m_data[1] = UNORM_INT8;
        pvVar12 = (void *)(reference->m_pixels).m_cap;
        if (pvVar12 != (void *)0x0) {
          pvVar12 = (reference->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_68,(TextureFormat *)&local_88,reference->m_width,reference->m_height,1,
                   pvVar12);
        local_88.m_data[0] = 0xff;
        local_88.m_data[1] = SNORM_INT8;
        local_88.m_data[2] = 0;
        local_88.m_data[3] = 0xff;
        tcu::clear(&local_68,&local_88);
        fVar18 = (float)local_cc * 0.5;
        iVar5 = (int)(fVar18 * -0.9 + fVar18);
        iVar6 = (int)(fVar18 * 0.9 + fVar18);
        if (iVar5 <= iVar6) {
          fVar18 = (float)local_d0 * 0.5;
          iVar7 = (int)(fVar18 * -0.9 + fVar18);
          iVar9 = (int)(fVar18 * 0.9 + fVar18);
          uVar10 = 0;
          iVar11 = iVar5;
          do {
            if (iVar7 <= iVar9) {
              fVar18 = (float)(iVar11 - iVar5) / (float)(iVar6 - iVar5);
              pvVar12 = (reference->m_pixels).m_ptr;
              iVar13 = iVar7;
              do {
                fVar19 = (float)(iVar13 - iVar7) / (float)(iVar9 - iVar7);
                local_68.super_ConstPixelBufferAccess.m_format.order = R;
                local_68.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                local_68.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                local_68.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
                local_88.m_data[0] = 0x3f800000;
                local_88.m_data[1] = SNORM_INT8;
                local_88.m_data[2] = 0;
                local_88.m_data[3] = 0x3f800000;
                local_78[0] = 0.0;
                local_78[1] = 1.0;
                local_78[2] = 0.0;
                local_78[3] = 1.0;
                local_40[0] = 0.0;
                local_40[1] = 0.0;
                puStack_38 = &DAT_3f8000003f800000;
                if (fVar18 <= fVar19) {
                  local_c8[8] = 0.0;
                  local_c8[9] = 0.0;
                  local_c8[10] = 0.0;
                  local_c8[0xb] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16 + 8] =
                         (float)local_68.super_ConstPixelBufferAccess.m_size.m_data[lVar16 + -2] *
                         (1.0 - fVar19);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_c8[4] = 0.0;
                  local_c8[5] = 0.0;
                  local_c8[6] = 0.0;
                  local_c8[7] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16 + 4] = local_40[lVar16] * (fVar19 - fVar18);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_c8[0xc] = 0.0;
                  local_c8[0xd] = 0.0;
                  local_c8[0xe] = 0.0;
                  local_c8[0xf] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16 + 0xc] = local_c8[lVar16 + 8] + local_c8[lVar16 + 4];
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_c8[0] = 0.0;
                  local_c8[1] = 0.0;
                  local_c8[2] = 0.0;
                  local_c8[3] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16] = local_78[lVar16] * fVar18;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_e8[0] = 0.0;
                  local_e8[1] = 0.0;
                  local_e8[2] = 0.0;
                  local_e8[3] = 0.0;
                  lVar16 = 0;
                  do {
                    local_e8[lVar16] = local_c8[lVar16 + 0xc] + local_c8[lVar16];
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                }
                else {
                  local_c8[8] = 0.0;
                  local_c8[9] = 0.0;
                  local_c8[10] = 0.0;
                  local_c8[0xb] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16 + 8] =
                         (float)local_68.super_ConstPixelBufferAccess.m_size.m_data[lVar16 + -2] *
                         (1.0 - fVar18);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_c8[4] = 0.0;
                  local_c8[5] = 0.0;
                  local_c8[6] = 0.0;
                  local_c8[7] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16 + 4] = (float)local_88.m_data[lVar16] * (fVar18 - fVar19);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_c8[0xc] = 0.0;
                  local_c8[0xd] = 0.0;
                  local_c8[0xe] = 0.0;
                  local_c8[0xf] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16 + 0xc] = local_c8[lVar16 + 8] + local_c8[lVar16 + 4];
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_c8[0] = 0.0;
                  local_c8[1] = 0.0;
                  local_c8[2] = 0.0;
                  local_c8[3] = 0.0;
                  lVar16 = 0;
                  do {
                    local_c8[lVar16] = local_78[lVar16] * fVar19;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                  local_e8[0] = 0.0;
                  local_e8[1] = 0.0;
                  local_e8[2] = 0.0;
                  local_e8[3] = 0.0;
                  lVar16 = 0;
                  do {
                    local_e8[lVar16] = local_c8[lVar16 + 0xc] + local_c8[lVar16];
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 4);
                }
                uVar8 = (uint)(local_e8[0] * 255.0);
                if (0xfe < (int)uVar8) {
                  uVar8 = 0xff;
                }
                if ((int)uVar8 < 1) {
                  uVar8 = uVar10;
                }
                uVar15 = (uint)(local_e8[1] * 255.0);
                if (0xfe < (int)uVar15) {
                  uVar15 = 0xff;
                }
                if ((int)uVar15 < 1) {
                  uVar15 = uVar10;
                }
                uVar17 = (uint)(local_e8[2] * 255.0);
                if (0xfe < (int)uVar17) {
                  uVar17 = 0xff;
                }
                if ((int)uVar17 < 1) {
                  uVar17 = uVar10;
                }
                uVar14 = (uint)(local_e8[3] * 255.0);
                if (0xfe < (int)uVar14) {
                  uVar14 = 0xff;
                }
                if ((int)uVar14 < 1) {
                  uVar14 = uVar10;
                }
                *(uint *)((long)pvVar12 + (long)(reference->m_width * iVar13 + iVar11) * 4) =
                     uVar17 << 0x10 | uVar15 << 8 | uVar14 << 0x18 | uVar8;
                iVar13 = iVar13 + 1;
              } while (iVar13 <= iVar9);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 <= iVar6);
        }
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"colorLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x2d5);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2ProgramSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(m_program->getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}